

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  pthread_mutex_t *__mutex;
  DescriptorPool *pool_00;
  ulong unaff_RBP;
  WrappedMutex *mu;
  anon_union_8_8_13f84498_for_Symbol_2 unaff_R12;
  ReaderMutexLock lock_1;
  bool bVar1;
  Symbol SVar2;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  string *local_38;
  
  __mutex = (pthread_mutex_t *)pool->mutex_;
  if (__mutex == (pthread_mutex_t *)0x0) {
    mu = (Mutex *)0x0;
  }
  else {
    std::mutex::lock((mutex *)&__mutex->__data);
    local_38 = name;
    if ((this->known_bad_files_)._M_h._M_element_count == 0 &&
        (this->known_bad_symbols_)._M_h._M_element_count == 0) {
      SVar2 = FindSymbol(this,name);
      unaff_R12 = SVar2.field_1;
      unaff_RBP = (ulong)SVar2.type;
      bVar1 = SVar2.type == NULL_SYMBOL;
    }
    else {
      bVar1 = true;
    }
    pthread_mutex_unlock(__mutex);
    if (!bVar1) goto LAB_00298a0e;
    mu = pool->mutex_;
    name = local_38;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_40,mu);
  if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_files_)._M_h);
  }
  SVar2 = FindSymbol(this,name);
  unaff_R12 = SVar2.field_1;
  unaff_RBP = (ulong)SVar2.type;
  if (SVar2.type == NULL_SYMBOL) {
    pool_00 = pool->underlay_;
    if (pool_00 != (DescriptorPool *)0x0) {
      SVar2 = FindByNameHelper((pool_00->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                               ._M_head_impl,pool_00,name);
      unaff_R12 = SVar2.field_1;
      unaff_RBP = (ulong)SVar2.type;
      if (SVar2.type != NULL_SYMBOL) goto LAB_00298a04;
    }
    bVar1 = TryFindSymbolInFallbackDatabase(pool,name);
    unaff_RBP = 0;
    if (bVar1) {
      SVar2 = FindSymbol(this,name);
      unaff_R12 = SVar2.field_1;
      unaff_RBP = (ulong)SVar2.type;
    }
  }
LAB_00298a04:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_40);
LAB_00298a0e:
  SVar2._0_8_ = unaff_RBP & 0xffffffff;
  SVar2.field_1.descriptor = unaff_R12.descriptor;
  return SVar2;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                const std::string& name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}